

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateTopKLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  TopKLayerParams *this_00;
  Tensor *this_01;
  int64_t iVar5;
  bool local_192;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string err_1;
  int rank;
  TopKLayerParams *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string err;
  _Self local_80;
  _Self local_78;
  _Self local_70;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,2,2);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar1;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    layer_00 = local_20;
    if (local_38 == 0) {
      local_3a = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"TopK",&local_61);
      validateInputOutputRankEquality
                (__return_storage_ptr__,layer_00,&local_60,&this->blobNameToRank);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        local_3a = 1;
      }
      local_38 = (uint)!bVar1;
      if ((local_3a & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,0);
        local_70._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->blobNameToRank,psVar3);
        local_78._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->blobNameToRank);
        bVar1 = std::operator!=(&local_70,&local_78);
        local_192 = false;
        if (bVar1) {
          psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(local_20,1);
          local_80._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,psVar3);
          err.field_2._8_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          local_192 = std::operator!=(&local_80,(_Self *)((long)&err.field_2 + 8));
        }
        if (local_192 != false) {
          psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(local_20,0);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(&this->blobNameToRank,psVar3);
          iVar2 = *pmVar4;
          psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(local_20,1);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(&this->blobNameToRank,psVar3);
          if (iVar2 != *pmVar4) {
            std::__cxx11::string::string((string *)local_a8);
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::__cxx11::string::string((string *)&params,(string *)psVar3);
            std::operator+(&local_e8,"Layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &params);
            std::operator+(&local_c8,&local_e8,
                           "\' of type \'TopK\' expects equal ranks for its input and second output, but they are not equal."
                          );
            std::__cxx11::string::operator=((string *)local_a8,(string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&params);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_a8);
            return __return_storage_ptr__;
          }
        }
        iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(local_20);
        if (0 < iVar2) {
          this_00 = Specification::NeuralNetworkLayer::topk(local_20);
          this_01 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
          err_1.field_2._12_4_ = Specification::Tensor::rank(this_01);
          iVar5 = Specification::TopKLayerParams::axis(this_00);
          if ((iVar5 < (int)-err_1.field_2._12_4_) ||
             (iVar5 = Specification::TopKLayerParams::axis(this_00),
             (int)err_1.field_2._12_4_ <= iVar5)) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::operator+(&local_158,
                           "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                           ,psVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,&local_158,"\' layer.");
            std::__cxx11::string::~string((string *)&local_158);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_138);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_138);
            return __return_storage_ptr__;
          }
        }
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateTopKLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "TopK", blobNameToRank));

    if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
        blobNameToRank.find(layer.output(1)) != blobNameToRank.end()) {
        if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.output(1))) {
            std::string err;
            err = "Layer '" + std::string(layer.name()) + "' of type 'TopK' expects equal ranks for its input and second output, but they are not equal.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.topk();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}